

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall
LoopCrosser::CellCrossesAnySubcell(LoopCrosser *this,S2ClippedShape *a_clipped,S2CellId b_id)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int i;
  pointer ppSVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar11;
  S2Point *pSVar12;
  S2Point *pSVar13;
  const_reference b_clipped;
  ulong uVar14;
  pointer ppSVar15;
  bool bVar16;
  vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_> *__range2;
  S2PaddedCell b_root;
  S2PaddedCell local_90;
  
  S2PaddedCell::S2PaddedCell(&local_90,b_id,0.0);
  bVar16 = 1 < *(uint *)&a_clipped->field_0x4;
  if (bVar16) {
    uVar10 = (ulong)(*(uint *)&a_clipped->field_0x4 >> 1);
    uVar14 = 0;
    do {
      paVar11 = &a_clipped->field_3;
      if (5 < *(uint *)&a_clipped->field_0x4) {
        paVar11 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(a_clipped->field_3).edges_;
      }
      i = *(int *)((long)paVar11 + uVar14 * 4);
      pSVar12 = S2Loop::vertex(this->a_,i);
      pSVar13 = S2Loop::vertex(this->a_,i + 1);
      S2CrossingEdgeQuery::GetCells(&this->b_query_,pSVar12,pSVar13,&local_90,&this->b_cells_);
      if ((this->b_cells_).
          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->b_cells_).
          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        bVar8 = false;
      }
      else {
        pSVar12 = S2Loop::vertex(this->a_,i);
        pSVar13 = S2Loop::vertex(this->a_,i + 1);
        (this->crosser_).a_ = pSVar12;
        (this->crosser_).b_ = pSVar13;
        dVar1 = pSVar12->c_[0];
        dVar2 = pSVar12->c_[1];
        dVar3 = pSVar13->c_[2];
        dVar4 = pSVar12->c_[2];
        dVar5 = pSVar13->c_[0];
        dVar6 = pSVar13->c_[1];
        (this->crosser_).a_cross_b_.c_[0] = dVar2 * dVar3 - dVar4 * dVar6;
        (this->crosser_).a_cross_b_.c_[1] = dVar4 * dVar5 - dVar3 * dVar1;
        (this->crosser_).a_cross_b_.c_[2] = dVar6 * dVar1 - dVar2 * dVar5;
        (this->crosser_).have_tangents_ = false;
        (this->crosser_).c_ = (S2Point *)0x0;
        this->aj_ = i;
        this->bj_prev_ = -2;
        ppSVar7 = (this->b_cells_).
                  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar8 = false;
        for (ppSVar15 = (this->b_cells_).
                        super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppSVar15 != ppSVar7;
            ppSVar15 = ppSVar15 + 1) {
          b_clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                      operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                  *)*ppSVar15,0);
          bVar9 = EdgeCrossesCell(this,b_clipped);
          if (bVar9) {
            bVar8 = true;
            break;
          }
        }
      }
      if (bVar8) {
        return bVar16;
      }
      uVar14 = uVar14 + 1;
      bVar16 = uVar14 < uVar10;
    } while (uVar14 != uVar10);
  }
  return bVar16;
}

Assistant:

bool LoopCrosser::CellCrossesAnySubcell(const S2ClippedShape& a_clipped,
                                        S2CellId b_id) {
  // Test all edges of "a_clipped" against all edges of B.  The relevant B
  // edges are guaranteed to be children of "b_id", which lets us find the
  // correct index cells more efficiently.
  S2PaddedCell b_root(b_id, 0);
  int a_num_edges = a_clipped.num_edges();
  for (int i = 0; i < a_num_edges; ++i) {
    int aj = a_clipped.edge(i);
    // Use an S2CrossingEdgeQuery starting at "b_root" to find the index cells
    // of B that might contain crossing edges.
    b_query_.GetCells(a_.vertex(aj), a_.vertex(aj+1), b_root, &b_cells_);
    if (b_cells_.empty()) continue;
    StartEdge(aj);
    for (const S2ShapeIndexCell* b_cell : b_cells_) {
      if (EdgeCrossesCell(b_cell->clipped(0))) return true;
    }
  }
  return false;
}